

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::LemmaLogger::startStep(LemmaLogger *this,ProgramBuilder *prg,bool inc)

{
  Var2Idx *this_00;
  int iVar1;
  pointer piVar2;
  SharedContext *pSVar3;
  bool bVar4;
  ProblemType PVar5;
  Atom_t AVar6;
  Literal LVar7;
  char *pcVar8;
  Id_t IVar9;
  Id_t id;
  long lVar10;
  uint uVar11;
  pointer pPVar12;
  LogicProgram *asp;
  uint uVar13;
  uint local_40 [2];
  LemmaLogger *local_38;
  
  LOCK();
  (this->logged_).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  iVar1 = this->step_;
  this->step_ = iVar1 + 1;
  if ((this->options_).logText == false) {
    if (iVar1 == 0) {
      pcVar8 = "";
      if (inc) {
        pcVar8 = " incremental";
      }
      fprintf((FILE *)this->str_,"asp 1 0 0%s\n",pcVar8);
    }
    else {
      fwrite("0\n",2,1,(FILE *)this->str_);
    }
  }
  PVar5 = (*prg->_vptr_ProgramBuilder[8])(prg);
  this->inputType_ = PVar5;
  if ((PVar5 == Asp) && (bVar4 = ProgramBuilder::endProgram(prg), bVar4)) {
    for (id = (Id_t)prg[0xb].parser_.ptr_;
        AVar6 = Asp::LogicProgram::startAuxAtom((LogicProgram *)prg), id != AVar6; id = id + 1) {
      LVar7 = Asp::LogicProgram::getLiteral((LogicProgram *)prg,id,(MapLit_t)0x0);
      uVar11 = LVar7.rep_ >> 2;
      if ((this->solver2asp_).ebo_.size <= uVar11) {
        local_40[1] = 0;
        bk_lib::pod_vector<int,_std::allocator<int>_>::resize
                  (&this->solver2asp_,uVar11 + 1,(int *)(local_40 + 1));
      }
      piVar2 = (this->solver2asp_).ebo_.buf;
      iVar1 = piVar2[uVar11];
      IVar9 = id;
      if (iVar1 == 0) {
        if ((LVar7.rep_ & 2) != 0) {
          IVar9 = -id;
        }
LAB_00114ee5:
        piVar2[uVar11] = IVar9;
      }
      else if ((LVar7.rep_ & 2) == 0 && iVar1 < 0) goto LAB_00114ee5;
    }
  }
  (this->solver2NameIdx_).ebo_.size = 0;
  if (((this->options_).logText == true) &&
     (local_38 = this, bVar4 = ProgramBuilder::endProgram(prg), bVar4)) {
    this_00 = &local_38->solver2NameIdx_;
    pSVar3 = prg->ctx_;
    pPVar12 = (pSVar3->output).preds_.ebo_.buf;
    uVar11 = 0;
    for (lVar10 = (ulong)(pSVar3->output).preds_.ebo_.size << 4; lVar10 != 0;
        lVar10 = lVar10 + -0x10) {
      uVar13 = (pPVar12->cond).rep_ >> 2;
      if ((char)(pSVar3->varInfo_).ebo_.buf[uVar13].rep < '\0') {
        if ((local_38->solver2NameIdx_).ebo_.size <= uVar13) {
          local_40[0] = 0xffffffff;
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (this_00,uVar13 + 1,local_40);
        }
        (this_00->ebo_).buf[uVar13] = uVar11;
      }
      pPVar12 = pPVar12 + 1;
      uVar11 = uVar11 + 1;
    }
  }
  return;
}

Assistant:

void LemmaLogger::startStep(ProgramBuilder& prg, bool inc) {
	logged_ = 0;
	++step_;
	if (!options_.logText) {
		if (step_ == 1) { fprintf(str_, "asp 1 0 0%s\n", inc ? " incremental" : ""); }
		else            { fprintf(str_, "0\n"); }
	}
	if ((inputType_ = static_cast<Problem_t::Type>(prg.type())) == Problem_t::Asp && prg.endProgram()) {
		// create solver variable to potassco literal mapping
		Asp::LogicProgram& asp = static_cast<Asp::LogicProgram&>(prg);
		for (Asp::Atom_t a = asp.startAtom(); a != asp.startAuxAtom(); ++a) {
			Literal sLit = asp.getLiteral(a);
			if (sLit.var() >= solver2asp_.size()) {
				solver2asp_.resize(sLit.var() + 1, 0);
			}
			Potassco::Lit_t& p = solver2asp_[sLit.var()];
			if (!p || (!sLit.sign() && p < 0)) {
				p = !sLit.sign() ? Potassco::lit(a) : Potassco::neg(a);
			}
		}
	}
	solver2NameIdx_.clear();
	if (options_.logText && prg.endProgram()) {
		const SharedContext& ctx = *prg.ctx();
		for (OutputTable::pred_iterator beg = ctx.output.pred_begin(), it = beg, end = ctx.output.pred_end(); it != end; ++it) {
			Var v = it->cond.var();
			if (ctx.varInfo(v).output()) {
				if (solver2NameIdx_.size() <= v) { solver2NameIdx_.resize(v + 1, UINT32_MAX); }
				solver2NameIdx_[v] = static_cast<uint32>(it - beg);
			}
		}
	}
}